

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

char * sqlite3_db_filename(sqlite3 *db,char *zDbName)

{
  Pager *pPVar1;
  Btree *pBVar2;
  char *pcVar3;
  
  pBVar2 = sqlite3DbNameToBtree(db,zDbName);
  if (pBVar2 == (Btree *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    pPVar1 = pBVar2->pBt->pPager;
    if (pPVar1->memDb == '\0') {
      pcVar3 = pPVar1->zFilename;
    }
    else {
      pcVar3 = "";
    }
  }
  return pcVar3;
}

Assistant:

SQLITE_API const char *SQLITE_STDCALL sqlite3_db_filename(sqlite3 *db, const char *zDbName){
  Btree *pBt;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ){
    (void)SQLITE_MISUSE_BKPT;
    return 0;
  }
#endif
  pBt = sqlite3DbNameToBtree(db, zDbName);
  return pBt ? sqlite3BtreeGetFilename(pBt) : 0;
}